

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

unsigned_long xmlParserFindNodeInfoIndex(xmlParserNodeInfoSeqPtr seq,xmlNodePtr node)

{
  xmlNodePtr pxVar1;
  bool bVar2;
  unsigned_long uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar3 = 0xffffffffffffffff;
  if (node != (xmlNodePtr)0x0 && seq != (xmlParserNodeInfoSeqPtr)0x0) {
    bVar2 = false;
    if (seq->length == 0) {
      uVar3 = 0;
    }
    else {
      uVar5 = seq->length;
      uVar7 = 1;
      do {
        uVar4 = uVar5 - uVar7 >> 1;
        uVar6 = (uVar4 + uVar7) - 1;
        pxVar1 = seq->buffer[uVar6].node;
        if (pxVar1 <= node) {
          uVar6 = uVar5;
        }
        if (pxVar1 == node) {
          uVar6 = uVar5;
        }
        uVar8 = uVar4 + 1 + uVar7;
        if (node <= pxVar1) {
          uVar8 = uVar7;
        }
        uVar3 = uVar4 + uVar7;
        if (pxVar1 == node) {
          bVar2 = true;
        }
      } while ((uVar8 <= uVar6) && (uVar5 = uVar6, uVar7 = uVar8, !bVar2));
    }
    if ((uVar3 != 0) && (node <= seq->buffer[uVar3 - 1].node)) {
      uVar3 = uVar3 - 1;
    }
  }
  return uVar3;
}

Assistant:

unsigned long
xmlParserFindNodeInfoIndex(xmlParserNodeInfoSeqPtr seq,
                           xmlNodePtr node)
{
    unsigned long upper, lower, middle;
    int found = 0;

    if ((seq == NULL) || (node == NULL))
        return ((unsigned long) -1);

    /* Do a binary search for the key */
    lower = 1;
    upper = seq->length;
    middle = 0;
    while (lower <= upper && !found) {
        middle = lower + (upper - lower) / 2;
        if (node == seq->buffer[middle - 1].node)
            found = 1;
        else if (node < seq->buffer[middle - 1].node)
            upper = middle - 1;
        else
            lower = middle + 1;
    }

    /* Return position */
    if (middle == 0 || seq->buffer[middle - 1].node < node)
        return middle;
    else
        return middle - 1;
}